

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O3

Side * __thiscall Application::querySide(Side *__return_storage_ptr__,Application *this)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 *puVar2;
  char value;
  char local_11;
  
  local_11 = (char)((ulong)in_RAX >> 0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"1) Buy",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"2) Sell",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"3) Sell Short",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"4) Sell Short Exempt",0x14);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"5) Cross",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"6) Cross Short",0xe);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"7) Cross Short Exempt",0x15);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Side: ",6);
  std::operator>>((istream *)&std::cin,&local_11);
  if ((byte)(local_11 - 0x31U) < 7) {
    FIX::CharField::CharField
              (&__return_storage_ptr__->super_CharField,0x36,
               (char)(0x41393836353231 >> ((local_11 - 0x31U) * '\b' & 0x3f)));
    (__return_storage_ptr__->super_CharField).super_FieldBase._vptr_FieldBase =
         (_func_int **)&PTR__FieldBase_00152bb0;
    return __return_storage_ptr__;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = FIX::DoubleConvertor::fast_fixed_dtoa;
  __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

FIX::Side Application::querySide() {
  char value;
  std::cout << std::endl
            << "1) Buy" << std::endl
            << "2) Sell" << std::endl
            << "3) Sell Short" << std::endl
            << "4) Sell Short Exempt" << std::endl
            << "5) Cross" << std::endl
            << "6) Cross Short" << std::endl
            << "7) Cross Short Exempt" << std::endl
            << "Side: ";

  std::cin >> value;
  switch (value) {
  case '1':
    return FIX::Side(FIX::Side_BUY);
  case '2':
    return FIX::Side(FIX::Side_SELL);
  case '3':
    return FIX::Side(FIX::Side_SELL_SHORT);
  case '4':
    return FIX::Side(FIX::Side_SELL_SHORT_EXEMPT);
  case '5':
    return FIX::Side(FIX::Side_CROSS);
  case '6':
    return FIX::Side(FIX::Side_CROSS_SHORT);
  case '7':
    return FIX::Side('A');
  default:
    throw std::exception();
  }
}